

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  float fVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  float logarithmic_zero_epsilon;
  float fVar11;
  float fVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  pIVar2 = GImGui;
  lVar8 = v_min - v_max;
  if (v_min < v_max) {
    lVar8 = -(v_min - v_max);
  }
  uVar7 = flags & 0x100000;
  uVar6 = data_type & 0xfffffffe;
  fVar17 = *(float *)((long)&(bb->Min).x + (ulong)(uVar7 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar7 >> 0x12));
  fVar18 = (fVar1 - fVar17) + -4.0;
  fVar15 = (GImGui->Style).GrabMinSize;
  if (-1 < lVar8 && uVar6 != 8) {
    fVar14 = fVar18 / (float)(lVar8 + 1);
    uVar10 = -(uint)(fVar15 <= fVar14);
    fVar15 = (float)(~uVar10 & (uint)fVar15 | (uint)fVar14 & uVar10);
  }
  if (fVar18 <= fVar15) {
    fVar15 = fVar18;
  }
  fVar19 = fVar18 - fVar15;
  fVar14 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if ((flags & 0x20U) != 0) {
    if (uVar6 == 8) {
      iVar3 = ImParseFormatPrecision(format,3);
      fVar14 = (float)iVar3;
    }
    else {
      fVar14 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar14);
    fVar14 = fVar19;
    if (fVar19 <= 1.0) {
      fVar14 = 1.0;
    }
    fVar14 = ((pIVar2->Style).LogSliderDeadzone * 0.5) / fVar14;
  }
  fVar17 = fVar17 + 2.0 + fVar15 * 0.5;
  if (pIVar2->ActiveId != id) {
    bVar9 = false;
    goto LAB_00172be7;
  }
  if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar2->ActiveIdIsJustActivated == true) {
      pIVar2->SliderCurrentAccum = 0.0;
      pIVar2->SliderCurrentAccumDirty = false;
    }
    IVar13 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar19 = IVar13.x;
    if (uVar7 != 0) {
      fVar19 = -IVar13.y;
    }
    if ((fVar19 != 0.0) || (NAN(fVar19))) {
      if ((uVar6 == 8) && (iVar3 = ImParseFormatPrecision(format,3), 0 < iVar3)) {
        fVar19 = fVar19 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar19 = fVar19 / 10.0;
        }
      }
      else if ((lVar8 + 100U < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        fVar19 = *(float *)(&DAT_0017c0d0 + (ulong)(fVar19 < 0.0) * 4) / (float)lVar8;
      }
      else {
        fVar19 = fVar19 / 100.0;
      }
      uVar6 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      pIVar2->SliderCurrentAccum =
           (float)(~uVar6 & (uint)fVar19 | (uint)(fVar19 * 10.0) & uVar6) +
           pIVar2->SliderCurrentAccum;
      pIVar2->SliderCurrentAccumDirty = true;
    }
    fVar19 = pIVar2->SliderCurrentAccum;
    if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar2->SliderCurrentAccumDirty == true) {
      uVar6 = (flags & 0x20U) >> 5;
      bVar9 = SUB41(uVar6,0);
      fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         (data_type,*v,v_min,v_max,bVar9,logarithmic_zero_epsilon,fVar14);
      if (((1.0 <= fVar12) && (0.0 < fVar19)) || ((fVar12 <= 0.0 && (fVar19 < 0.0)))) {
        fVar16 = 0.0;
        bVar9 = false;
        fVar11 = fVar12;
      }
      else {
        fVar16 = fVar19 + fVar12;
        fVar11 = 1.0;
        if (fVar16 <= 1.0) {
          fVar11 = fVar16;
        }
        fVar11 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar11);
        uVar5 = (unsigned_long_long)uVar6;
        uVar4 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                          (data_type,fVar11,v_min,v_max,bVar9,logarithmic_zero_epsilon,fVar14);
        if ((flags & 0x40U) == 0) {
          uVar4 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                            ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)uVar4,
                             uVar5);
        }
        fVar16 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           (data_type,uVar4,v_min,v_max,bVar9,logarithmic_zero_epsilon,fVar14);
        fVar16 = fVar16 - fVar12;
        if (fVar19 <= 0.0) {
          fVar16 = (float)(~-(uint)(fVar19 <= fVar16) & (uint)fVar19 |
                          (uint)fVar16 & -(uint)(fVar19 <= fVar16));
        }
        else if (fVar19 <= fVar16) {
          fVar16 = fVar19;
        }
        fVar16 = pIVar2->SliderCurrentAccum - fVar16;
        bVar9 = true;
      }
      pIVar2->SliderCurrentAccum = fVar16;
      pIVar2->SliderCurrentAccumDirty = false;
      goto LAB_00172b6c;
    }
    bVar9 = false;
    fVar11 = 0.0;
  }
  else {
    fVar11 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        if (0.0 < fVar19) {
          fVar19 = (*(float *)((pIVar2->IO).MouseDown + (ulong)(uVar7 >> 0x14) * 4 + -8) - fVar17) /
                   fVar19;
          fVar11 = 1.0;
          if (fVar19 <= 1.0) {
            fVar11 = fVar19;
          }
          fVar11 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar11);
        }
        if (uVar7 != 0) {
          fVar11 = 1.0 - fVar11;
        }
        bVar9 = true;
        goto LAB_00172b6c;
      }
      ClearActiveID();
    }
    fVar11 = 0.0;
    bVar9 = false;
  }
LAB_00172b6c:
  if (bVar9) {
    uVar6 = (flags & 0x20U) >> 5;
    uVar5 = (unsigned_long_long)uVar6;
    uVar4 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                      (data_type,fVar11,v_min,v_max,SUB41(uVar6,0),logarithmic_zero_epsilon,fVar14);
    if ((flags & 0x40U) == 0) {
      uVar4 = RoundScalarWithFormatT<unsigned_long_long,long_long>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)uVar4,uVar5);
    }
    bVar9 = *v != uVar4;
    if (bVar9) {
      *v = uVar4;
      bVar9 = true;
    }
  }
  else {
    bVar9 = false;
  }
LAB_00172be7:
  if (1.0 <= fVar18) {
    fVar18 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                        logarithmic_zero_epsilon,fVar14);
    if (uVar7 != 0) {
      fVar18 = 1.0 - fVar18;
    }
    fVar17 = (((fVar1 + -2.0) - fVar15 * 0.5) - fVar17) * fVar18 + fVar17;
    if (uVar7 != 0) {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar15 * 0.5 + fVar17;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar15 * 0.5 + fVar17;
    }
    else {
      fVar1 = (bb->Min).y;
      fVar18 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar15 * 0.5 + fVar17;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar15 * 0.5 + fVar17;
      (out_grab_bb->Max).y = fVar18 + -2.0;
    }
  }
  else {
    IVar13 = bb->Min;
    out_grab_bb->Min = IVar13;
    out_grab_bb->Max = IVar13;
  }
  return bVar9;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}